

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

void * handle_accept(void *arg)

{
  ulong uVar1;
  _func_int **pp_Var2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  _func_int **pp_Var6;
  char *pcVar7;
  size_t sVar8;
  mapped_type *this;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined1 local_1610 [8];
  CharContent res;
  char v_log_7 [200];
  CharContent local_1518;
  undefined1 local_14f0 [8];
  CharContent res_content_7;
  char v_log_6 [200];
  CharContent local_13f8;
  undefined1 local_13d0 [8];
  CharContent res_content_6;
  char v_log_5 [200];
  undefined1 local_12b8 [8];
  CharContent res_content_5;
  undefined1 local_11b0 [4];
  int resource_find_ret;
  source server_resource;
  char v_log_4 [200];
  CharContent local_10b8;
  undefined1 local_1090 [8];
  CharContent res_content_4;
  char v_log_3 [200];
  undefined1 local_f78 [8];
  CharContent res_content_3;
  char local_f48 [4];
  int ret_fd_1;
  char entity_buf [1024];
  size_t local_b40;
  ssize_t entity_read_size;
  undefined1 local_b30 [4];
  int epoll_ret_num;
  ulong local_b08;
  size_t all;
  CharContent local_af8;
  _Node_iterator_base<std::pair<const_CharContent,_CharContent>,_true> local_ad0;
  char acStack_ac8 [8];
  char v_log_2 [200];
  undefined1 local_9d8 [8];
  CharContent res_content_2;
  undefined1 local_988 [8];
  HttpRequest http_parser;
  char v_log_1 [200];
  undefined1 local_7f8 [8];
  CharContent res_content_1;
  char acStack_7c8 [8];
  char v_log [200];
  CharContent local_6f8;
  undefined1 local_6d0 [8];
  CharContent res_content;
  char local_678 [4];
  int ret_fd;
  char buf [1024];
  undefined1 local_270 [8];
  CharContent ret_request;
  ssize_t read_size;
  undefined1 local_238 [4];
  int ret_num;
  epoll_event event_ret;
  int epoll_fd;
  Epoll e;
  HttpResponse http_response;
  undefined1 local_1c8 [8];
  Response response;
  Request request;
  int connfd;
  int *ptr;
  void *arg_local;
  
  request.headers._M_h._M_single_bucket._4_4_ = *arg;
  if (arg != (void *)0x0) {
    operator_delete(arg);
  }
  Request::Request((Request *)
                   &response.cookies.super__Vector_base<CharContent,_std::allocator<CharContent>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
  Response::Response((Response *)local_1c8);
  HttpResponse::HttpResponse((HttpResponse *)&e.epoll_fd);
  Epoll::Epoll((Epoll *)((long)&event_ret.data + 4),1);
  Epoll::make_ctl((Epoll *)((long)&event_ret.data + 4),1,request.headers._M_h._M_single_bucket._4_4_
                  ,1);
  event_ret.data.fd = Epoll::get_epoll_fd((Epoll *)((long)&event_ret.data + 4));
  ret_request.m_length = 0xffffffffffffffff;
  CharContent::CharContent((CharContent *)local_270);
  memset(local_678,0,0x400);
  do {
    do {
      uVar4 = epoll_wait(event_ret.data.fd,(epoll_event *)local_238,1,15000);
      if ((int)uVar4 < 1) goto LAB_0012134d;
    } while ((ret_num != request.headers._M_h._M_single_bucket._4_4_) ||
            (((uint)local_238 & 1) == 0));
    ret_request.m_length = read(request.headers._M_h._M_single_bucket._4_4_,local_678,0x400);
    if ((long)ret_request.m_length < 1) break;
    CharContent::append((CharContent *)local_270,local_678,ret_request.m_length);
    memset(local_678,0,0x400);
    CharContent::CharContent((CharContent *)&res_content.m_length,"\r\n\r\n");
    pp_Var6 = (_func_int **)
              CharContent::find((CharContent *)local_270,(CharContent *)&res_content.m_length,0);
    pp_Var2 = ret_request._vptr_CharContent;
    CharContent::~CharContent((CharContent *)&res_content.m_length);
  } while (pp_Var6 == pp_Var2);
LAB_0012134d:
  pcVar7 = CharContent::c_str((CharContent *)local_270);
  sVar8 = CharContent::length((CharContent *)local_270);
  write(1,pcVar7,sVar8);
  if ((int)uVar4 < 0) {
    CharContent::CharContent(&local_6f8,"500");
    HttpResponse::response_content((CharContent *)local_6d0,(HttpResponse *)&e.epoll_fd,&local_6f8);
    CharContent::~CharContent(&local_6f8);
    v_log[0xa8] = '\0';
    v_log[0xa9] = '\0';
    v_log[0xaa] = '\0';
    v_log[0xab] = '\0';
    v_log[0xac] = '\0';
    v_log[0xad] = '\0';
    v_log[0xae] = '\0';
    v_log[0xaf] = '\0';
    v_log[0xb0] = '\0';
    v_log[0xb1] = '\0';
    v_log[0xb2] = '\0';
    v_log[0xb3] = '\0';
    v_log[0xb4] = '\0';
    v_log[0xb5] = '\0';
    v_log[0xb6] = '\0';
    v_log[0xb7] = '\0';
    v_log[0x98] = '\0';
    v_log[0x99] = '\0';
    v_log[0x9a] = '\0';
    v_log[0x9b] = '\0';
    v_log[0x9c] = '\0';
    v_log[0x9d] = '\0';
    v_log[0x9e] = '\0';
    v_log[0x9f] = '\0';
    v_log[0xa0] = '\0';
    v_log[0xa1] = '\0';
    v_log[0xa2] = '\0';
    v_log[0xa3] = '\0';
    v_log[0xa4] = '\0';
    v_log[0xa5] = '\0';
    v_log[0xa6] = '\0';
    v_log[0xa7] = '\0';
    v_log[0x88] = '\0';
    v_log[0x89] = '\0';
    v_log[0x8a] = '\0';
    v_log[0x8b] = '\0';
    v_log[0x8c] = '\0';
    v_log[0x8d] = '\0';
    v_log[0x8e] = '\0';
    v_log[0x8f] = '\0';
    v_log[0x90] = '\0';
    v_log[0x91] = '\0';
    v_log[0x92] = '\0';
    v_log[0x93] = '\0';
    v_log[0x94] = '\0';
    v_log[0x95] = '\0';
    v_log[0x96] = '\0';
    v_log[0x97] = '\0';
    v_log[0x78] = '\0';
    v_log[0x79] = '\0';
    v_log[0x7a] = '\0';
    v_log[0x7b] = '\0';
    v_log[0x7c] = '\0';
    v_log[0x7d] = '\0';
    v_log[0x7e] = '\0';
    v_log[0x7f] = '\0';
    v_log[0x80] = '\0';
    v_log[0x81] = '\0';
    v_log[0x82] = '\0';
    v_log[0x83] = '\0';
    v_log[0x84] = '\0';
    v_log[0x85] = '\0';
    v_log[0x86] = '\0';
    v_log[0x87] = '\0';
    v_log[0x68] = '\0';
    v_log[0x69] = '\0';
    v_log[0x6a] = '\0';
    v_log[0x6b] = '\0';
    v_log[0x6c] = '\0';
    v_log[0x6d] = '\0';
    v_log[0x6e] = '\0';
    v_log[0x6f] = '\0';
    v_log[0x70] = '\0';
    v_log[0x71] = '\0';
    v_log[0x72] = '\0';
    v_log[0x73] = '\0';
    v_log[0x74] = '\0';
    v_log[0x75] = '\0';
    v_log[0x76] = '\0';
    v_log[0x77] = '\0';
    v_log[0x58] = '\0';
    v_log[0x59] = '\0';
    v_log[0x5a] = '\0';
    v_log[0x5b] = '\0';
    v_log[0x5c] = '\0';
    v_log[0x5d] = '\0';
    v_log[0x5e] = '\0';
    v_log[0x5f] = '\0';
    v_log[0x60] = '\0';
    v_log[0x61] = '\0';
    v_log[0x62] = '\0';
    v_log[99] = '\0';
    v_log[100] = '\0';
    v_log[0x65] = '\0';
    v_log[0x66] = '\0';
    v_log[0x67] = '\0';
    v_log[0x48] = '\0';
    v_log[0x49] = '\0';
    v_log[0x4a] = '\0';
    v_log[0x4b] = '\0';
    v_log[0x4c] = '\0';
    v_log[0x4d] = '\0';
    v_log[0x4e] = '\0';
    v_log[0x4f] = '\0';
    v_log[0x50] = '\0';
    v_log[0x51] = '\0';
    v_log[0x52] = '\0';
    v_log[0x53] = '\0';
    v_log[0x54] = '\0';
    v_log[0x55] = '\0';
    v_log[0x56] = '\0';
    v_log[0x57] = '\0';
    v_log[0x38] = '\0';
    v_log[0x39] = '\0';
    v_log[0x3a] = '\0';
    v_log[0x3b] = '\0';
    v_log[0x3c] = '\0';
    v_log[0x3d] = '\0';
    v_log[0x3e] = '\0';
    v_log[0x3f] = '\0';
    v_log[0x40] = '\0';
    v_log[0x41] = '\0';
    v_log[0x42] = '\0';
    v_log[0x43] = '\0';
    v_log[0x44] = '\0';
    v_log[0x45] = '\0';
    v_log[0x46] = '\0';
    v_log[0x47] = '\0';
    v_log[0x28] = '\0';
    v_log[0x29] = '\0';
    v_log[0x2a] = '\0';
    v_log[0x2b] = '\0';
    v_log[0x2c] = '\0';
    v_log[0x2d] = '\0';
    v_log[0x2e] = '\0';
    v_log[0x2f] = '\0';
    v_log[0x30] = '\0';
    v_log[0x31] = '\0';
    v_log[0x32] = '\0';
    v_log[0x33] = '\0';
    v_log[0x34] = '\0';
    v_log[0x35] = '\0';
    v_log[0x36] = '\0';
    v_log[0x37] = '\0';
    v_log[0x18] = '\0';
    v_log[0x19] = '\0';
    v_log[0x1a] = '\0';
    v_log[0x1b] = '\0';
    v_log[0x1c] = '\0';
    v_log[0x1d] = '\0';
    v_log[0x1e] = '\0';
    v_log[0x1f] = '\0';
    v_log[0x20] = '\0';
    v_log[0x21] = '\0';
    v_log[0x22] = '\0';
    v_log[0x23] = '\0';
    v_log[0x24] = '\0';
    v_log[0x25] = '\0';
    v_log[0x26] = '\0';
    v_log[0x27] = '\0';
    v_log[8] = '\0';
    v_log[9] = '\0';
    v_log[10] = '\0';
    v_log[0xb] = '\0';
    v_log[0xc] = '\0';
    v_log[0xd] = '\0';
    v_log[0xe] = '\0';
    v_log[0xf] = '\0';
    v_log[0x10] = '\0';
    v_log[0x11] = '\0';
    v_log[0x12] = '\0';
    v_log[0x13] = '\0';
    v_log[0x14] = '\0';
    v_log[0x15] = '\0';
    v_log[0x16] = '\0';
    v_log[0x17] = '\0';
    acStack_7c8[0] = '\0';
    acStack_7c8[1] = '\0';
    acStack_7c8[2] = '\0';
    acStack_7c8[3] = '\0';
    acStack_7c8[4] = '\0';
    acStack_7c8[5] = '\0';
    acStack_7c8[6] = '\0';
    acStack_7c8[7] = '\0';
    v_log[0] = '\0';
    v_log[1] = '\0';
    v_log[2] = '\0';
    v_log[3] = '\0';
    v_log[4] = '\0';
    v_log[5] = '\0';
    v_log[6] = '\0';
    v_log[7] = '\0';
    v_log[0xb8] = '\0';
    v_log[0xb9] = '\0';
    v_log[0xba] = '\0';
    v_log[0xbb] = '\0';
    v_log[0xbc] = '\0';
    v_log[0xbd] = '\0';
    v_log[0xbe] = '\0';
    v_log[0xbf] = '\0';
    snprintf(acStack_7c8,200,"ret_num %d\n",(ulong)uVar4);
    log((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    arg_local = response_to_client((CharContent *)local_6d0,
                                   request.headers._M_h._M_single_bucket._4_4_);
    res_content_1.m_length._4_4_ = 1;
    CharContent::~CharContent((CharContent *)local_6d0);
    goto LAB_00122379;
  }
  if ((long)ret_request.m_length < 0) {
    CharContent::CharContent((CharContent *)(v_log_1 + 0xc0),"500");
    HttpResponse::response_content
              ((CharContent *)local_7f8,(HttpResponse *)&e.epoll_fd,(CharContent *)(v_log_1 + 0xc0))
    ;
    CharContent::~CharContent((CharContent *)(v_log_1 + 0xc0));
    v_log_1[0xa8] = '\0';
    v_log_1[0xa9] = '\0';
    v_log_1[0xaa] = '\0';
    v_log_1[0xab] = '\0';
    v_log_1[0xac] = '\0';
    v_log_1[0xad] = '\0';
    v_log_1[0xae] = '\0';
    v_log_1[0xaf] = '\0';
    v_log_1[0xb0] = '\0';
    v_log_1[0xb1] = '\0';
    v_log_1[0xb2] = '\0';
    v_log_1[0xb3] = '\0';
    v_log_1[0xb4] = '\0';
    v_log_1[0xb5] = '\0';
    v_log_1[0xb6] = '\0';
    v_log_1[0xb7] = '\0';
    v_log_1[0x98] = '\0';
    v_log_1[0x99] = '\0';
    v_log_1[0x9a] = '\0';
    v_log_1[0x9b] = '\0';
    v_log_1[0x9c] = '\0';
    v_log_1[0x9d] = '\0';
    v_log_1[0x9e] = '\0';
    v_log_1[0x9f] = '\0';
    v_log_1[0xa0] = '\0';
    v_log_1[0xa1] = '\0';
    v_log_1[0xa2] = '\0';
    v_log_1[0xa3] = '\0';
    v_log_1[0xa4] = '\0';
    v_log_1[0xa5] = '\0';
    v_log_1[0xa6] = '\0';
    v_log_1[0xa7] = '\0';
    v_log_1[0x88] = '\0';
    v_log_1[0x89] = '\0';
    v_log_1[0x8a] = '\0';
    v_log_1[0x8b] = '\0';
    v_log_1[0x8c] = '\0';
    v_log_1[0x8d] = '\0';
    v_log_1[0x8e] = '\0';
    v_log_1[0x8f] = '\0';
    v_log_1[0x90] = '\0';
    v_log_1[0x91] = '\0';
    v_log_1[0x92] = '\0';
    v_log_1[0x93] = '\0';
    v_log_1[0x94] = '\0';
    v_log_1[0x95] = '\0';
    v_log_1[0x96] = '\0';
    v_log_1[0x97] = '\0';
    v_log_1[0x78] = '\0';
    v_log_1[0x79] = '\0';
    v_log_1[0x7a] = '\0';
    v_log_1[0x7b] = '\0';
    v_log_1[0x7c] = '\0';
    v_log_1[0x7d] = '\0';
    v_log_1[0x7e] = '\0';
    v_log_1[0x7f] = '\0';
    v_log_1[0x80] = '\0';
    v_log_1[0x81] = '\0';
    v_log_1[0x82] = '\0';
    v_log_1[0x83] = '\0';
    v_log_1[0x84] = '\0';
    v_log_1[0x85] = '\0';
    v_log_1[0x86] = '\0';
    v_log_1[0x87] = '\0';
    v_log_1[0x68] = '\0';
    v_log_1[0x69] = '\0';
    v_log_1[0x6a] = '\0';
    v_log_1[0x6b] = '\0';
    v_log_1[0x6c] = '\0';
    v_log_1[0x6d] = '\0';
    v_log_1[0x6e] = '\0';
    v_log_1[0x6f] = '\0';
    v_log_1[0x70] = '\0';
    v_log_1[0x71] = '\0';
    v_log_1[0x72] = '\0';
    v_log_1[0x73] = '\0';
    v_log_1[0x74] = '\0';
    v_log_1[0x75] = '\0';
    v_log_1[0x76] = '\0';
    v_log_1[0x77] = '\0';
    v_log_1[0x58] = '\0';
    v_log_1[0x59] = '\0';
    v_log_1[0x5a] = '\0';
    v_log_1[0x5b] = '\0';
    v_log_1[0x5c] = '\0';
    v_log_1[0x5d] = '\0';
    v_log_1[0x5e] = '\0';
    v_log_1[0x5f] = '\0';
    v_log_1[0x60] = '\0';
    v_log_1[0x61] = '\0';
    v_log_1[0x62] = '\0';
    v_log_1[99] = '\0';
    v_log_1[100] = '\0';
    v_log_1[0x65] = '\0';
    v_log_1[0x66] = '\0';
    v_log_1[0x67] = '\0';
    v_log_1[0x48] = '\0';
    v_log_1[0x49] = '\0';
    v_log_1[0x4a] = '\0';
    v_log_1[0x4b] = '\0';
    v_log_1[0x4c] = '\0';
    v_log_1[0x4d] = '\0';
    v_log_1[0x4e] = '\0';
    v_log_1[0x4f] = '\0';
    v_log_1[0x50] = '\0';
    v_log_1[0x51] = '\0';
    v_log_1[0x52] = '\0';
    v_log_1[0x53] = '\0';
    v_log_1[0x54] = '\0';
    v_log_1[0x55] = '\0';
    v_log_1[0x56] = '\0';
    v_log_1[0x57] = '\0';
    v_log_1[0x38] = '\0';
    v_log_1[0x39] = '\0';
    v_log_1[0x3a] = '\0';
    v_log_1[0x3b] = '\0';
    v_log_1[0x3c] = '\0';
    v_log_1[0x3d] = '\0';
    v_log_1[0x3e] = '\0';
    v_log_1[0x3f] = '\0';
    v_log_1[0x40] = '\0';
    v_log_1[0x41] = '\0';
    v_log_1[0x42] = '\0';
    v_log_1[0x43] = '\0';
    v_log_1[0x44] = '\0';
    v_log_1[0x45] = '\0';
    v_log_1[0x46] = '\0';
    v_log_1[0x47] = '\0';
    v_log_1[0x28] = '\0';
    v_log_1[0x29] = '\0';
    v_log_1[0x2a] = '\0';
    v_log_1[0x2b] = '\0';
    v_log_1[0x2c] = '\0';
    v_log_1[0x2d] = '\0';
    v_log_1[0x2e] = '\0';
    v_log_1[0x2f] = '\0';
    v_log_1[0x30] = '\0';
    v_log_1[0x31] = '\0';
    v_log_1[0x32] = '\0';
    v_log_1[0x33] = '\0';
    v_log_1[0x34] = '\0';
    v_log_1[0x35] = '\0';
    v_log_1[0x36] = '\0';
    v_log_1[0x37] = '\0';
    v_log_1[0x18] = '\0';
    v_log_1[0x19] = '\0';
    v_log_1[0x1a] = '\0';
    v_log_1[0x1b] = '\0';
    v_log_1[0x1c] = '\0';
    v_log_1[0x1d] = '\0';
    v_log_1[0x1e] = '\0';
    v_log_1[0x1f] = '\0';
    v_log_1[0x20] = '\0';
    v_log_1[0x21] = '\0';
    v_log_1[0x22] = '\0';
    v_log_1[0x23] = '\0';
    v_log_1[0x24] = '\0';
    v_log_1[0x25] = '\0';
    v_log_1[0x26] = '\0';
    v_log_1[0x27] = '\0';
    v_log_1[8] = '\0';
    v_log_1[9] = '\0';
    v_log_1[10] = '\0';
    v_log_1[0xb] = '\0';
    v_log_1[0xc] = '\0';
    v_log_1[0xd] = '\0';
    v_log_1[0xe] = '\0';
    v_log_1[0xf] = '\0';
    v_log_1[0x10] = '\0';
    v_log_1[0x11] = '\0';
    v_log_1[0x12] = '\0';
    v_log_1[0x13] = '\0';
    v_log_1[0x14] = '\0';
    v_log_1[0x15] = '\0';
    v_log_1[0x16] = '\0';
    v_log_1[0x17] = '\0';
    http_parser.request.m_length = 0;
    v_log_1[0] = '\0';
    v_log_1[1] = '\0';
    v_log_1[2] = '\0';
    v_log_1[3] = '\0';
    v_log_1[4] = '\0';
    v_log_1[5] = '\0';
    v_log_1[6] = '\0';
    v_log_1[7] = '\0';
    v_log_1[0xb8] = '\0';
    v_log_1[0xb9] = '\0';
    v_log_1[0xba] = '\0';
    v_log_1[0xbb] = '\0';
    v_log_1[0xbc] = '\0';
    v_log_1[0xbd] = '\0';
    v_log_1[0xbe] = '\0';
    v_log_1[0xbf] = '\0';
    snprintf((char *)&http_parser.request.m_length,200,"read_size %lu\n",ret_request.m_length);
    log((double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
    arg_local = response_to_client((CharContent *)local_7f8,
                                   request.headers._M_h._M_single_bucket._4_4_);
    res_content_1.m_length._4_4_ = 1;
    CharContent::~CharContent((CharContent *)local_7f8);
    goto LAB_00122379;
  }
  CharContent::CharContent((CharContent *)&res_content_2.m_length,(CharContent *)local_270);
  HttpRequest::HttpRequest((HttpRequest *)local_988,(CharContent *)&res_content_2.m_length);
  CharContent::~CharContent((CharContent *)&res_content_2.m_length);
  bVar3 = HttpRequest::handle_request
                    ((HttpRequest *)local_988,
                     (Request *)
                     &response.cookies.super__Vector_base<CharContent,_std::allocator<CharContent>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (bVar3) {
    CharContent::CharContent(&local_af8,"Content-Length");
    local_ad0._M_cur =
         (__node_type *)
         std::
         unordered_map<CharContent,_CharContent,_hashFunc,_EqualFunc,_std::allocator<std::pair<const_CharContent,_CharContent>_>_>
         ::find((unordered_map<CharContent,_CharContent,_hashFunc,_EqualFunc,_std::allocator<std::pair<const_CharContent,_CharContent>_>_>
                 *)&request.Entity.m_length,&local_af8);
    all = (size_t)std::
                  unordered_map<CharContent,_CharContent,_hashFunc,_EqualFunc,_std::allocator<std::pair<const_CharContent,_CharContent>_>_>
                  ::end((unordered_map<CharContent,_CharContent,_hashFunc,_EqualFunc,_std::allocator<std::pair<const_CharContent,_CharContent>_>_>
                         *)&request.Entity.m_length);
    bVar3 = std::__detail::operator!=
                      (&local_ad0,
                       (_Node_iterator_base<std::pair<const_CharContent,_CharContent>,_true> *)&all)
    ;
    CharContent::~CharContent(&local_af8);
    if (bVar3) {
      local_b08 = 0;
      CharContent::CharContent((CharContent *)local_b30,"Content-Length");
      this = std::
             unordered_map<CharContent,_CharContent,_hashFunc,_EqualFunc,_std::allocator<std::pair<const_CharContent,_CharContent>_>_>
             ::operator[]((unordered_map<CharContent,_CharContent,_hashFunc,_EqualFunc,_std::allocator<std::pair<const_CharContent,_CharContent>_>_>
                           *)&request.Entity.m_length,(key_type *)local_b30);
      pcVar7 = CharContent::c_str(this);
      __isoc99_sscanf(pcVar7,"%lu",&local_b08);
      CharContent::~CharContent((CharContent *)local_b30);
      entity_read_size._4_4_ = 0xffffffff;
      local_b40 = 0;
      memset(local_f48,0,0x400);
      while( true ) {
        do {
          uVar1 = local_b08;
          sVar8 = CharContent::length((CharContent *)&request.protocol.m_length);
          if ((uVar1 <= sVar8) ||
             (entity_read_size._4_4_ =
                   epoll_wait(event_ret.data.fd,(epoll_event *)local_238,1,20000),
             (int)entity_read_size._4_4_ < 1)) goto LAB_00121aee;
          res_content_3.m_length._4_4_ = ret_num;
        } while ((ret_num != request.headers._M_h._M_single_bucket._4_4_) ||
                (((uint)local_238 & 1) == 0));
        local_b40 = read(request.headers._M_h._M_single_bucket._4_4_,local_f48,0x400);
        if ((long)local_b40 < 1) break;
        CharContent::append((CharContent *)&request.protocol.m_length,local_f48,local_b40);
        memset(local_f48,0,0x400);
      }
LAB_00121aee:
      if ((int)entity_read_size._4_4_ < 0) {
        CharContent::CharContent((CharContent *)(v_log_3 + 0xc0),"500");
        HttpResponse::response_content
                  ((CharContent *)local_f78,(HttpResponse *)&e.epoll_fd,
                   (CharContent *)(v_log_3 + 0xc0));
        CharContent::~CharContent((CharContent *)(v_log_3 + 0xc0));
        v_log_3[0xa8] = '\0';
        v_log_3[0xa9] = '\0';
        v_log_3[0xaa] = '\0';
        v_log_3[0xab] = '\0';
        v_log_3[0xac] = '\0';
        v_log_3[0xad] = '\0';
        v_log_3[0xae] = '\0';
        v_log_3[0xaf] = '\0';
        v_log_3[0xb0] = '\0';
        v_log_3[0xb1] = '\0';
        v_log_3[0xb2] = '\0';
        v_log_3[0xb3] = '\0';
        v_log_3[0xb4] = '\0';
        v_log_3[0xb5] = '\0';
        v_log_3[0xb6] = '\0';
        v_log_3[0xb7] = '\0';
        v_log_3[0x98] = '\0';
        v_log_3[0x99] = '\0';
        v_log_3[0x9a] = '\0';
        v_log_3[0x9b] = '\0';
        v_log_3[0x9c] = '\0';
        v_log_3[0x9d] = '\0';
        v_log_3[0x9e] = '\0';
        v_log_3[0x9f] = '\0';
        v_log_3[0xa0] = '\0';
        v_log_3[0xa1] = '\0';
        v_log_3[0xa2] = '\0';
        v_log_3[0xa3] = '\0';
        v_log_3[0xa4] = '\0';
        v_log_3[0xa5] = '\0';
        v_log_3[0xa6] = '\0';
        v_log_3[0xa7] = '\0';
        v_log_3[0x88] = '\0';
        v_log_3[0x89] = '\0';
        v_log_3[0x8a] = '\0';
        v_log_3[0x8b] = '\0';
        v_log_3[0x8c] = '\0';
        v_log_3[0x8d] = '\0';
        v_log_3[0x8e] = '\0';
        v_log_3[0x8f] = '\0';
        v_log_3[0x90] = '\0';
        v_log_3[0x91] = '\0';
        v_log_3[0x92] = '\0';
        v_log_3[0x93] = '\0';
        v_log_3[0x94] = '\0';
        v_log_3[0x95] = '\0';
        v_log_3[0x96] = '\0';
        v_log_3[0x97] = '\0';
        v_log_3[0x78] = '\0';
        v_log_3[0x79] = '\0';
        v_log_3[0x7a] = '\0';
        v_log_3[0x7b] = '\0';
        v_log_3[0x7c] = '\0';
        v_log_3[0x7d] = '\0';
        v_log_3[0x7e] = '\0';
        v_log_3[0x7f] = '\0';
        v_log_3[0x80] = '\0';
        v_log_3[0x81] = '\0';
        v_log_3[0x82] = '\0';
        v_log_3[0x83] = '\0';
        v_log_3[0x84] = '\0';
        v_log_3[0x85] = '\0';
        v_log_3[0x86] = '\0';
        v_log_3[0x87] = '\0';
        v_log_3[0x68] = '\0';
        v_log_3[0x69] = '\0';
        v_log_3[0x6a] = '\0';
        v_log_3[0x6b] = '\0';
        v_log_3[0x6c] = '\0';
        v_log_3[0x6d] = '\0';
        v_log_3[0x6e] = '\0';
        v_log_3[0x6f] = '\0';
        v_log_3[0x70] = '\0';
        v_log_3[0x71] = '\0';
        v_log_3[0x72] = '\0';
        v_log_3[0x73] = '\0';
        v_log_3[0x74] = '\0';
        v_log_3[0x75] = '\0';
        v_log_3[0x76] = '\0';
        v_log_3[0x77] = '\0';
        v_log_3[0x58] = '\0';
        v_log_3[0x59] = '\0';
        v_log_3[0x5a] = '\0';
        v_log_3[0x5b] = '\0';
        v_log_3[0x5c] = '\0';
        v_log_3[0x5d] = '\0';
        v_log_3[0x5e] = '\0';
        v_log_3[0x5f] = '\0';
        v_log_3[0x60] = '\0';
        v_log_3[0x61] = '\0';
        v_log_3[0x62] = '\0';
        v_log_3[99] = '\0';
        v_log_3[100] = '\0';
        v_log_3[0x65] = '\0';
        v_log_3[0x66] = '\0';
        v_log_3[0x67] = '\0';
        v_log_3[0x48] = '\0';
        v_log_3[0x49] = '\0';
        v_log_3[0x4a] = '\0';
        v_log_3[0x4b] = '\0';
        v_log_3[0x4c] = '\0';
        v_log_3[0x4d] = '\0';
        v_log_3[0x4e] = '\0';
        v_log_3[0x4f] = '\0';
        v_log_3[0x50] = '\0';
        v_log_3[0x51] = '\0';
        v_log_3[0x52] = '\0';
        v_log_3[0x53] = '\0';
        v_log_3[0x54] = '\0';
        v_log_3[0x55] = '\0';
        v_log_3[0x56] = '\0';
        v_log_3[0x57] = '\0';
        v_log_3[0x38] = '\0';
        v_log_3[0x39] = '\0';
        v_log_3[0x3a] = '\0';
        v_log_3[0x3b] = '\0';
        v_log_3[0x3c] = '\0';
        v_log_3[0x3d] = '\0';
        v_log_3[0x3e] = '\0';
        v_log_3[0x3f] = '\0';
        v_log_3[0x40] = '\0';
        v_log_3[0x41] = '\0';
        v_log_3[0x42] = '\0';
        v_log_3[0x43] = '\0';
        v_log_3[0x44] = '\0';
        v_log_3[0x45] = '\0';
        v_log_3[0x46] = '\0';
        v_log_3[0x47] = '\0';
        v_log_3[0x28] = '\0';
        v_log_3[0x29] = '\0';
        v_log_3[0x2a] = '\0';
        v_log_3[0x2b] = '\0';
        v_log_3[0x2c] = '\0';
        v_log_3[0x2d] = '\0';
        v_log_3[0x2e] = '\0';
        v_log_3[0x2f] = '\0';
        v_log_3[0x30] = '\0';
        v_log_3[0x31] = '\0';
        v_log_3[0x32] = '\0';
        v_log_3[0x33] = '\0';
        v_log_3[0x34] = '\0';
        v_log_3[0x35] = '\0';
        v_log_3[0x36] = '\0';
        v_log_3[0x37] = '\0';
        v_log_3[0x18] = '\0';
        v_log_3[0x19] = '\0';
        v_log_3[0x1a] = '\0';
        v_log_3[0x1b] = '\0';
        v_log_3[0x1c] = '\0';
        v_log_3[0x1d] = '\0';
        v_log_3[0x1e] = '\0';
        v_log_3[0x1f] = '\0';
        v_log_3[0x20] = '\0';
        v_log_3[0x21] = '\0';
        v_log_3[0x22] = '\0';
        v_log_3[0x23] = '\0';
        v_log_3[0x24] = '\0';
        v_log_3[0x25] = '\0';
        v_log_3[0x26] = '\0';
        v_log_3[0x27] = '\0';
        v_log_3[8] = '\0';
        v_log_3[9] = '\0';
        v_log_3[10] = '\0';
        v_log_3[0xb] = '\0';
        v_log_3[0xc] = '\0';
        v_log_3[0xd] = '\0';
        v_log_3[0xe] = '\0';
        v_log_3[0xf] = '\0';
        v_log_3[0x10] = '\0';
        v_log_3[0x11] = '\0';
        v_log_3[0x12] = '\0';
        v_log_3[0x13] = '\0';
        v_log_3[0x14] = '\0';
        v_log_3[0x15] = '\0';
        v_log_3[0x16] = '\0';
        v_log_3[0x17] = '\0';
        res_content_4.m_length = 0;
        v_log_3[0] = '\0';
        v_log_3[1] = '\0';
        v_log_3[2] = '\0';
        v_log_3[3] = '\0';
        v_log_3[4] = '\0';
        v_log_3[5] = '\0';
        v_log_3[6] = '\0';
        v_log_3[7] = '\0';
        v_log_3[0xb8] = '\0';
        v_log_3[0xb9] = '\0';
        v_log_3[0xba] = '\0';
        v_log_3[0xbb] = '\0';
        v_log_3[0xbc] = '\0';
        v_log_3[0xbd] = '\0';
        v_log_3[0xbe] = '\0';
        v_log_3[0xbf] = '\0';
        snprintf((char *)&res_content_4.m_length,200,"epoll_ret_num %d\n",
                 (ulong)entity_read_size._4_4_);
        log((double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02));
        arg_local = response_to_client((CharContent *)local_f78,
                                       request.headers._M_h._M_single_bucket._4_4_);
        res_content_1.m_length._4_4_ = 1;
        CharContent::~CharContent((CharContent *)local_f78);
      }
      else {
        if (-1 < (long)local_b40) goto LAB_00121dca;
        CharContent::CharContent(&local_10b8,"500");
        HttpResponse::response_content
                  ((CharContent *)local_1090,(HttpResponse *)&e.epoll_fd,&local_10b8);
        CharContent::~CharContent(&local_10b8);
        server_resource.url_maps.super__Vector_base<map_item,_std::allocator<map_item>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        snprintf((char *)&server_resource.url_maps.
                          super__Vector_base<map_item,_std::allocator<map_item>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,200,"entity_read_size %lu\n",
                 local_b40);
        log((double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03));
        arg_local = response_to_client((CharContent *)local_1090,
                                       request.headers._M_h._M_single_bucket._4_4_);
        res_content_1.m_length._4_4_ = 1;
        CharContent::~CharContent((CharContent *)local_1090);
      }
    }
    else {
LAB_00121dca:
      Epoll::make_ctl((Epoll *)((long)&event_ret.data + 4),2,
                      request.headers._M_h._M_single_bucket._4_4_,1);
      source::source((source *)local_11b0,request.headers._M_h._M_single_bucket._4_4_);
      Request::Request((Request *)&res_content_5.m_length,
                       (Request *)
                       &response.cookies.
                        super__Vector_base<CharContent,_std::allocator<CharContent>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
      iVar5 = source::resource_find
                        ((source *)local_11b0,(Request *)&res_content_5.m_length,
                         (Response *)local_1c8);
      Request::~Request((Request *)&res_content_5.m_length);
      if (iVar5 == 1) {
        CharContent::CharContent((CharContent *)(v_log_5 + 0xc0),"404");
        HttpResponse::response_content
                  ((CharContent *)local_12b8,(HttpResponse *)&e.epoll_fd,
                   (CharContent *)(v_log_5 + 0xc0));
        CharContent::~CharContent((CharContent *)(v_log_5 + 0xc0));
        v_log_5[0xa8] = '\0';
        v_log_5[0xa9] = '\0';
        v_log_5[0xaa] = '\0';
        v_log_5[0xab] = '\0';
        v_log_5[0xac] = '\0';
        v_log_5[0xad] = '\0';
        v_log_5[0xae] = '\0';
        v_log_5[0xaf] = '\0';
        v_log_5[0xb0] = '\0';
        v_log_5[0xb1] = '\0';
        v_log_5[0xb2] = '\0';
        v_log_5[0xb3] = '\0';
        v_log_5[0xb4] = '\0';
        v_log_5[0xb5] = '\0';
        v_log_5[0xb6] = '\0';
        v_log_5[0xb7] = '\0';
        v_log_5[0x98] = '\0';
        v_log_5[0x99] = '\0';
        v_log_5[0x9a] = '\0';
        v_log_5[0x9b] = '\0';
        v_log_5[0x9c] = '\0';
        v_log_5[0x9d] = '\0';
        v_log_5[0x9e] = '\0';
        v_log_5[0x9f] = '\0';
        v_log_5[0xa0] = '\0';
        v_log_5[0xa1] = '\0';
        v_log_5[0xa2] = '\0';
        v_log_5[0xa3] = '\0';
        v_log_5[0xa4] = '\0';
        v_log_5[0xa5] = '\0';
        v_log_5[0xa6] = '\0';
        v_log_5[0xa7] = '\0';
        v_log_5[0x88] = '\0';
        v_log_5[0x89] = '\0';
        v_log_5[0x8a] = '\0';
        v_log_5[0x8b] = '\0';
        v_log_5[0x8c] = '\0';
        v_log_5[0x8d] = '\0';
        v_log_5[0x8e] = '\0';
        v_log_5[0x8f] = '\0';
        v_log_5[0x90] = '\0';
        v_log_5[0x91] = '\0';
        v_log_5[0x92] = '\0';
        v_log_5[0x93] = '\0';
        v_log_5[0x94] = '\0';
        v_log_5[0x95] = '\0';
        v_log_5[0x96] = '\0';
        v_log_5[0x97] = '\0';
        v_log_5[0x78] = '\0';
        v_log_5[0x79] = '\0';
        v_log_5[0x7a] = '\0';
        v_log_5[0x7b] = '\0';
        v_log_5[0x7c] = '\0';
        v_log_5[0x7d] = '\0';
        v_log_5[0x7e] = '\0';
        v_log_5[0x7f] = '\0';
        v_log_5[0x80] = '\0';
        v_log_5[0x81] = '\0';
        v_log_5[0x82] = '\0';
        v_log_5[0x83] = '\0';
        v_log_5[0x84] = '\0';
        v_log_5[0x85] = '\0';
        v_log_5[0x86] = '\0';
        v_log_5[0x87] = '\0';
        v_log_5[0x68] = '\0';
        v_log_5[0x69] = '\0';
        v_log_5[0x6a] = '\0';
        v_log_5[0x6b] = '\0';
        v_log_5[0x6c] = '\0';
        v_log_5[0x6d] = '\0';
        v_log_5[0x6e] = '\0';
        v_log_5[0x6f] = '\0';
        v_log_5[0x70] = '\0';
        v_log_5[0x71] = '\0';
        v_log_5[0x72] = '\0';
        v_log_5[0x73] = '\0';
        v_log_5[0x74] = '\0';
        v_log_5[0x75] = '\0';
        v_log_5[0x76] = '\0';
        v_log_5[0x77] = '\0';
        v_log_5[0x58] = '\0';
        v_log_5[0x59] = '\0';
        v_log_5[0x5a] = '\0';
        v_log_5[0x5b] = '\0';
        v_log_5[0x5c] = '\0';
        v_log_5[0x5d] = '\0';
        v_log_5[0x5e] = '\0';
        v_log_5[0x5f] = '\0';
        v_log_5[0x60] = '\0';
        v_log_5[0x61] = '\0';
        v_log_5[0x62] = '\0';
        v_log_5[99] = '\0';
        v_log_5[100] = '\0';
        v_log_5[0x65] = '\0';
        v_log_5[0x66] = '\0';
        v_log_5[0x67] = '\0';
        v_log_5[0x48] = '\0';
        v_log_5[0x49] = '\0';
        v_log_5[0x4a] = '\0';
        v_log_5[0x4b] = '\0';
        v_log_5[0x4c] = '\0';
        v_log_5[0x4d] = '\0';
        v_log_5[0x4e] = '\0';
        v_log_5[0x4f] = '\0';
        v_log_5[0x50] = '\0';
        v_log_5[0x51] = '\0';
        v_log_5[0x52] = '\0';
        v_log_5[0x53] = '\0';
        v_log_5[0x54] = '\0';
        v_log_5[0x55] = '\0';
        v_log_5[0x56] = '\0';
        v_log_5[0x57] = '\0';
        v_log_5[0x38] = '\0';
        v_log_5[0x39] = '\0';
        v_log_5[0x3a] = '\0';
        v_log_5[0x3b] = '\0';
        v_log_5[0x3c] = '\0';
        v_log_5[0x3d] = '\0';
        v_log_5[0x3e] = '\0';
        v_log_5[0x3f] = '\0';
        v_log_5[0x40] = '\0';
        v_log_5[0x41] = '\0';
        v_log_5[0x42] = '\0';
        v_log_5[0x43] = '\0';
        v_log_5[0x44] = '\0';
        v_log_5[0x45] = '\0';
        v_log_5[0x46] = '\0';
        v_log_5[0x47] = '\0';
        v_log_5[0x28] = '\0';
        v_log_5[0x29] = '\0';
        v_log_5[0x2a] = '\0';
        v_log_5[0x2b] = '\0';
        v_log_5[0x2c] = '\0';
        v_log_5[0x2d] = '\0';
        v_log_5[0x2e] = '\0';
        v_log_5[0x2f] = '\0';
        v_log_5[0x30] = '\0';
        v_log_5[0x31] = '\0';
        v_log_5[0x32] = '\0';
        v_log_5[0x33] = '\0';
        v_log_5[0x34] = '\0';
        v_log_5[0x35] = '\0';
        v_log_5[0x36] = '\0';
        v_log_5[0x37] = '\0';
        v_log_5[0x18] = '\0';
        v_log_5[0x19] = '\0';
        v_log_5[0x1a] = '\0';
        v_log_5[0x1b] = '\0';
        v_log_5[0x1c] = '\0';
        v_log_5[0x1d] = '\0';
        v_log_5[0x1e] = '\0';
        v_log_5[0x1f] = '\0';
        v_log_5[0x20] = '\0';
        v_log_5[0x21] = '\0';
        v_log_5[0x22] = '\0';
        v_log_5[0x23] = '\0';
        v_log_5[0x24] = '\0';
        v_log_5[0x25] = '\0';
        v_log_5[0x26] = '\0';
        v_log_5[0x27] = '\0';
        v_log_5[8] = '\0';
        v_log_5[9] = '\0';
        v_log_5[10] = '\0';
        v_log_5[0xb] = '\0';
        v_log_5[0xc] = '\0';
        v_log_5[0xd] = '\0';
        v_log_5[0xe] = '\0';
        v_log_5[0xf] = '\0';
        v_log_5[0x10] = '\0';
        v_log_5[0x11] = '\0';
        v_log_5[0x12] = '\0';
        v_log_5[0x13] = '\0';
        v_log_5[0x14] = '\0';
        v_log_5[0x15] = '\0';
        v_log_5[0x16] = '\0';
        v_log_5[0x17] = '\0';
        res_content_6.m_length = 0;
        v_log_5[0] = '\0';
        v_log_5[1] = '\0';
        v_log_5[2] = '\0';
        v_log_5[3] = '\0';
        v_log_5[4] = '\0';
        v_log_5[5] = '\0';
        v_log_5[6] = '\0';
        v_log_5[7] = '\0';
        v_log_5[0xb8] = '\0';
        v_log_5[0xb9] = '\0';
        v_log_5[0xba] = '\0';
        v_log_5[0xbb] = '\0';
        v_log_5[0xbc] = '\0';
        v_log_5[0xbd] = '\0';
        v_log_5[0xbe] = '\0';
        v_log_5[0xbf] = '\0';
        snprintf((char *)&res_content_6.m_length,200,"resource_find_ret %d\n",1);
        log((double)CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04));
        arg_local = response_to_client((CharContent *)local_12b8,
                                       request.headers._M_h._M_single_bucket._4_4_);
        res_content_1.m_length._4_4_ = 1;
        CharContent::~CharContent((CharContent *)local_12b8);
      }
      else if (iVar5 == 2) {
        CharContent::CharContent(&local_13f8,"400");
        HttpResponse::response_content
                  ((CharContent *)local_13d0,(HttpResponse *)&e.epoll_fd,&local_13f8);
        CharContent::~CharContent(&local_13f8);
        res_content_7.m_length = 0;
        snprintf((char *)&res_content_7.m_length,200,"resource_find_ret %d\n",2);
        log((double)CONCAT44(extraout_XMM0_Db_05,extraout_XMM0_Da_05));
        arg_local = response_to_client((CharContent *)local_13d0,
                                       request.headers._M_h._M_single_bucket._4_4_);
        res_content_1.m_length._4_4_ = 1;
        CharContent::~CharContent((CharContent *)local_13d0);
      }
      else if (iVar5 == 3) {
        CharContent::CharContent(&local_1518,"500");
        HttpResponse::response_content
                  ((CharContent *)local_14f0,(HttpResponse *)&e.epoll_fd,&local_1518);
        CharContent::~CharContent(&local_1518);
        res.m_length = 0;
        snprintf((char *)&res.m_length,200,"resource_find_ret %d\n",3);
        log((double)CONCAT44(extraout_XMM0_Db_06,extraout_XMM0_Da_06));
        arg_local = response_to_client((CharContent *)local_14f0,
                                       request.headers._M_h._M_single_bucket._4_4_);
        res_content_1.m_length._4_4_ = 1;
        CharContent::~CharContent((CharContent *)local_14f0);
      }
      else {
        HttpResponse::response_content
                  ((CharContent *)local_1610,(HttpResponse *)&e.epoll_fd,(Response *)local_1c8,
                   (Request *)
                   &response.cookies.super__Vector_base<CharContent,_std::allocator<CharContent>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        arg_local = response_to_client((CharContent *)local_1610,
                                       request.headers._M_h._M_single_bucket._4_4_);
        res_content_1.m_length._4_4_ = 1;
        CharContent::~CharContent((CharContent *)local_1610);
      }
      source::~source((source *)local_11b0);
    }
  }
  else {
    CharContent::CharContent((CharContent *)(v_log_2 + 0xc0),"400");
    HttpResponse::response_content
              ((CharContent *)local_9d8,(HttpResponse *)&e.epoll_fd,(CharContent *)(v_log_2 + 0xc0))
    ;
    CharContent::~CharContent((CharContent *)(v_log_2 + 0xc0));
    v_log_2[0xa8] = '\0';
    v_log_2[0xa9] = '\0';
    v_log_2[0xaa] = '\0';
    v_log_2[0xab] = '\0';
    v_log_2[0xac] = '\0';
    v_log_2[0xad] = '\0';
    v_log_2[0xae] = '\0';
    v_log_2[0xaf] = '\0';
    v_log_2[0xb0] = '\0';
    v_log_2[0xb1] = '\0';
    v_log_2[0xb2] = '\0';
    v_log_2[0xb3] = '\0';
    v_log_2[0xb4] = '\0';
    v_log_2[0xb5] = '\0';
    v_log_2[0xb6] = '\0';
    v_log_2[0xb7] = '\0';
    v_log_2[0x98] = '\0';
    v_log_2[0x99] = '\0';
    v_log_2[0x9a] = '\0';
    v_log_2[0x9b] = '\0';
    v_log_2[0x9c] = '\0';
    v_log_2[0x9d] = '\0';
    v_log_2[0x9e] = '\0';
    v_log_2[0x9f] = '\0';
    v_log_2[0xa0] = '\0';
    v_log_2[0xa1] = '\0';
    v_log_2[0xa2] = '\0';
    v_log_2[0xa3] = '\0';
    v_log_2[0xa4] = '\0';
    v_log_2[0xa5] = '\0';
    v_log_2[0xa6] = '\0';
    v_log_2[0xa7] = '\0';
    v_log_2[0x88] = '\0';
    v_log_2[0x89] = '\0';
    v_log_2[0x8a] = '\0';
    v_log_2[0x8b] = '\0';
    v_log_2[0x8c] = '\0';
    v_log_2[0x8d] = '\0';
    v_log_2[0x8e] = '\0';
    v_log_2[0x8f] = '\0';
    v_log_2[0x90] = '\0';
    v_log_2[0x91] = '\0';
    v_log_2[0x92] = '\0';
    v_log_2[0x93] = '\0';
    v_log_2[0x94] = '\0';
    v_log_2[0x95] = '\0';
    v_log_2[0x96] = '\0';
    v_log_2[0x97] = '\0';
    v_log_2[0x78] = '\0';
    v_log_2[0x79] = '\0';
    v_log_2[0x7a] = '\0';
    v_log_2[0x7b] = '\0';
    v_log_2[0x7c] = '\0';
    v_log_2[0x7d] = '\0';
    v_log_2[0x7e] = '\0';
    v_log_2[0x7f] = '\0';
    v_log_2[0x80] = '\0';
    v_log_2[0x81] = '\0';
    v_log_2[0x82] = '\0';
    v_log_2[0x83] = '\0';
    v_log_2[0x84] = '\0';
    v_log_2[0x85] = '\0';
    v_log_2[0x86] = '\0';
    v_log_2[0x87] = '\0';
    v_log_2[0x68] = '\0';
    v_log_2[0x69] = '\0';
    v_log_2[0x6a] = '\0';
    v_log_2[0x6b] = '\0';
    v_log_2[0x6c] = '\0';
    v_log_2[0x6d] = '\0';
    v_log_2[0x6e] = '\0';
    v_log_2[0x6f] = '\0';
    v_log_2[0x70] = '\0';
    v_log_2[0x71] = '\0';
    v_log_2[0x72] = '\0';
    v_log_2[0x73] = '\0';
    v_log_2[0x74] = '\0';
    v_log_2[0x75] = '\0';
    v_log_2[0x76] = '\0';
    v_log_2[0x77] = '\0';
    v_log_2[0x58] = '\0';
    v_log_2[0x59] = '\0';
    v_log_2[0x5a] = '\0';
    v_log_2[0x5b] = '\0';
    v_log_2[0x5c] = '\0';
    v_log_2[0x5d] = '\0';
    v_log_2[0x5e] = '\0';
    v_log_2[0x5f] = '\0';
    v_log_2[0x60] = '\0';
    v_log_2[0x61] = '\0';
    v_log_2[0x62] = '\0';
    v_log_2[99] = '\0';
    v_log_2[100] = '\0';
    v_log_2[0x65] = '\0';
    v_log_2[0x66] = '\0';
    v_log_2[0x67] = '\0';
    v_log_2[0x48] = '\0';
    v_log_2[0x49] = '\0';
    v_log_2[0x4a] = '\0';
    v_log_2[0x4b] = '\0';
    v_log_2[0x4c] = '\0';
    v_log_2[0x4d] = '\0';
    v_log_2[0x4e] = '\0';
    v_log_2[0x4f] = '\0';
    v_log_2[0x50] = '\0';
    v_log_2[0x51] = '\0';
    v_log_2[0x52] = '\0';
    v_log_2[0x53] = '\0';
    v_log_2[0x54] = '\0';
    v_log_2[0x55] = '\0';
    v_log_2[0x56] = '\0';
    v_log_2[0x57] = '\0';
    v_log_2[0x38] = '\0';
    v_log_2[0x39] = '\0';
    v_log_2[0x3a] = '\0';
    v_log_2[0x3b] = '\0';
    v_log_2[0x3c] = '\0';
    v_log_2[0x3d] = '\0';
    v_log_2[0x3e] = '\0';
    v_log_2[0x3f] = '\0';
    v_log_2[0x40] = '\0';
    v_log_2[0x41] = '\0';
    v_log_2[0x42] = '\0';
    v_log_2[0x43] = '\0';
    v_log_2[0x44] = '\0';
    v_log_2[0x45] = '\0';
    v_log_2[0x46] = '\0';
    v_log_2[0x47] = '\0';
    v_log_2[0x28] = '\0';
    v_log_2[0x29] = '\0';
    v_log_2[0x2a] = '\0';
    v_log_2[0x2b] = '\0';
    v_log_2[0x2c] = '\0';
    v_log_2[0x2d] = '\0';
    v_log_2[0x2e] = '\0';
    v_log_2[0x2f] = '\0';
    v_log_2[0x30] = '\0';
    v_log_2[0x31] = '\0';
    v_log_2[0x32] = '\0';
    v_log_2[0x33] = '\0';
    v_log_2[0x34] = '\0';
    v_log_2[0x35] = '\0';
    v_log_2[0x36] = '\0';
    v_log_2[0x37] = '\0';
    v_log_2[0x18] = '\0';
    v_log_2[0x19] = '\0';
    v_log_2[0x1a] = '\0';
    v_log_2[0x1b] = '\0';
    v_log_2[0x1c] = '\0';
    v_log_2[0x1d] = '\0';
    v_log_2[0x1e] = '\0';
    v_log_2[0x1f] = '\0';
    v_log_2[0x20] = '\0';
    v_log_2[0x21] = '\0';
    v_log_2[0x22] = '\0';
    v_log_2[0x23] = '\0';
    v_log_2[0x24] = '\0';
    v_log_2[0x25] = '\0';
    v_log_2[0x26] = '\0';
    v_log_2[0x27] = '\0';
    v_log_2[8] = '\0';
    v_log_2[9] = '\0';
    v_log_2[10] = '\0';
    v_log_2[0xb] = '\0';
    v_log_2[0xc] = '\0';
    v_log_2[0xd] = '\0';
    v_log_2[0xe] = '\0';
    v_log_2[0xf] = '\0';
    v_log_2[0x10] = '\0';
    v_log_2[0x11] = '\0';
    v_log_2[0x12] = '\0';
    v_log_2[0x13] = '\0';
    v_log_2[0x14] = '\0';
    v_log_2[0x15] = '\0';
    v_log_2[0x16] = '\0';
    v_log_2[0x17] = '\0';
    acStack_ac8[0] = '\0';
    acStack_ac8[1] = '\0';
    acStack_ac8[2] = '\0';
    acStack_ac8[3] = '\0';
    acStack_ac8[4] = '\0';
    acStack_ac8[5] = '\0';
    acStack_ac8[6] = '\0';
    acStack_ac8[7] = '\0';
    v_log_2[0] = '\0';
    v_log_2[1] = '\0';
    v_log_2[2] = '\0';
    v_log_2[3] = '\0';
    v_log_2[4] = '\0';
    v_log_2[5] = '\0';
    v_log_2[6] = '\0';
    v_log_2[7] = '\0';
    v_log_2[0xb8] = '\0';
    v_log_2[0xb9] = '\0';
    v_log_2[0xba] = '\0';
    v_log_2[0xbb] = '\0';
    v_log_2[0xbc] = '\0';
    v_log_2[0xbd] = '\0';
    v_log_2[0xbe] = '\0';
    v_log_2[0xbf] = '\0';
    snprintf(acStack_ac8,200,"http_parser\n");
    log((double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
    arg_local = response_to_client((CharContent *)local_9d8,
                                   request.headers._M_h._M_single_bucket._4_4_);
    res_content_1.m_length._4_4_ = 1;
    CharContent::~CharContent((CharContent *)local_9d8);
  }
  HttpRequest::~HttpRequest((HttpRequest *)local_988);
LAB_00122379:
  CharContent::~CharContent((CharContent *)local_270);
  Epoll::~Epoll((Epoll *)((long)&event_ret.data + 4));
  HttpResponse::~HttpResponse((HttpResponse *)&e.epoll_fd);
  Response::~Response((Response *)local_1c8);
  Request::~Request((Request *)
                    &response.cookies.super__Vector_base<CharContent,_std::allocator<CharContent>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
  return arg_local;
}

Assistant:

void *handle_accept(void *arg){
    int *ptr=(int *)arg;
    int connfd=*ptr;
    delete ptr;

    Request request;
    Response response;
    HttpResponse http_response;


    Epoll e(1);
    e.make_ctl(EPOLL_CTL_ADD,connfd,EPOLLIN);
    int epoll_fd=e.get_epoll_fd();
    epoll_event event_ret;
    int ret_num=-1;
    ssize_t read_size=-1;
    CharContent ret_request;
    char buf[1024]={'\0'};
    while(true){
        ret_num=epoll_wait(epoll_fd,&event_ret,1,15000);
        if(ret_num<1){
            break;
        }
        int ret_fd=event_ret.data.fd;
        if(ret_fd==connfd&&(event_ret.events&EPOLLIN)){
            read_size=read(connfd,buf,sizeof(buf));
            if(read_size<=0){
                break;
            }
            ret_request.append(buf,read_size);
            memset(buf,'\0',sizeof(buf));
            if(ret_request.find(CharContent("\r\n\r\n"))!=ret_request.npos){
                break;
            }
        }
    }
    write(STDOUT_FILENO,ret_request.c_str(),ret_request.length());
    if(ret_num<0){
        CharContent res_content(http_response.response_content(CharContent("500")));
        char v_log[200]={'\0'};
        snprintf(v_log,sizeof(v_log),"ret_num %d\n",ret_num);
        log(v_log);
        return response_to_client(res_content,connfd);
    }
    if(read_size<0){
        CharContent res_content(http_response.response_content(CharContent("500")));
        char v_log[200]={'\0'};
        snprintf(v_log,sizeof(v_log),"read_size %lu\n",read_size);
        log(v_log);
        return response_to_client(res_content,connfd);
    }
    HttpRequest http_parser(ret_request);
    if(!http_parser.handle_request(&request)){
        CharContent res_content(http_response.response_content(CharContent("400")));
        char v_log[200]={'\0'};
        snprintf(v_log,sizeof(v_log),"http_parser\n");
        log(v_log);
        return response_to_client(res_content,connfd);
    }
    if(request.headers.find(CharContent("Content-Length"))!=request.headers.end()){
        size_t all=0;
        sscanf(request.headers["Content-Length"].c_str(),"%lu",&all);
        int epoll_ret_num=-1;
        ssize_t entity_read_size=0;
        char entity_buf[1024]={'\0'};
        while(true){
            if(all<=request.Entity.length()){
                break;
            }
            epoll_ret_num=epoll_wait(epoll_fd,&event_ret,1,20000);
            if(epoll_ret_num<1){
                break;
            }
            int ret_fd=event_ret.data.fd;
            if(ret_fd==connfd&&(event_ret.events&EPOLLIN)){
                entity_read_size=read(connfd,entity_buf,sizeof(entity_buf));
                if(entity_read_size<=0){
                    break;
                }
                request.Entity.append(entity_buf,entity_read_size);
                memset(entity_buf,'\0',sizeof(entity_buf));
            }
        }
        if(epoll_ret_num<0){
            CharContent res_content(http_response.response_content(CharContent("500")));
            char v_log[200]={'\0'};
            snprintf(v_log,sizeof(v_log),"epoll_ret_num %d\n",epoll_ret_num);
            log(v_log);
            return response_to_client(res_content,connfd);
        }
        if(entity_read_size<0){
            CharContent res_content(http_response.response_content(CharContent("500")));
            char v_log[200]={'\0'};
            snprintf(v_log,sizeof(v_log),"entity_read_size %lu\n",entity_read_size);
            log(v_log);
            return response_to_client(res_content,connfd);
        }
    }
    e.make_ctl(EPOLL_CTL_DEL,connfd,EPOLLIN);
    source server_resource(connfd);
    int resource_find_ret=server_resource.resource_find(request,&response);
    /*
     * 0 ok
     * 1 not find resource
     * 2 file type unknow(not file or document)
     * 3 exec error
     */
    if(resource_find_ret==1){
        CharContent res_content(http_response.response_content(CharContent("404")));
        char v_log[200]={'\0'};
        snprintf(v_log,sizeof(v_log),"resource_find_ret %d\n",resource_find_ret);
        log(v_log);
        return response_to_client(res_content,connfd);
    }
    if(resource_find_ret==2){
        CharContent res_content(http_response.response_content(CharContent("400")));
        char v_log[200]={'\0'};
        snprintf(v_log,sizeof(v_log),"resource_find_ret %d\n",resource_find_ret);
        log(v_log);
        return response_to_client(res_content,connfd);
    }
    if(resource_find_ret==3){
        CharContent res_content(http_response.response_content(CharContent("500")));
        char v_log[200]={'\0'};
        snprintf(v_log,sizeof(v_log),"resource_find_ret %d\n",resource_find_ret);
        log(v_log);
        return response_to_client(res_content,connfd);
    }
    CharContent res(http_response.response_content(&response,&request));
    return response_to_client(res,connfd);
}